

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O2

DdNode * cuddBddLICBuildResult(DdManager *dd,DdNode *f,st__table *cache,st__table *table)

{
  int *piVar1;
  int iVar2;
  DdNode *T;
  DdNode *E;
  DdNode *pDVar3;
  ulong uVar4;
  DdNode *T_00;
  int *piVar5;
  uint uVar6;
  DdNode *r;
  int markings;
  DdNode *local_50;
  DdNode *local_48;
  int local_40;
  uint local_3c;
  DdNode *local_38;
  
  piVar5 = (int *)((ulong)f & 0xfffffffffffffffe);
  if (*piVar5 == 0x7fffffff) {
    return f;
  }
  E = dd->one;
  iVar2 = st__lookup(cache,(char *)piVar5,(char **)&local_50);
  if (iVar2 != 0) {
    return (DdNode *)((ulong)((uint)f & 1) ^ (ulong)local_50);
  }
  iVar2 = st__lookup_int(table,(char *)piVar5,(int *)&local_3c);
  if (iVar2 == 0) {
    return (DdNode *)0x0;
  }
  local_40 = *piVar5;
  pDVar3 = *(DdNode **)(piVar5 + 6);
  T = E;
  if (((int)local_3c >> 2 != 1) && (T = (DdNode *)((ulong)E ^ 1), (int)local_3c >> 2 == 3)) {
    local_48 = (DdNode *)CONCAT44(local_48._4_4_,local_3c);
    local_38 = pDVar3;
    T = cuddBddLICBuildResult(dd,*(DdNode **)(piVar5 + 4),cache,table);
    pDVar3 = local_38;
    local_3c = (uint)local_48;
    if (T == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
  }
  uVar6 = local_3c & 3;
  T_00 = (DdNode *)((ulong)T & 0xfffffffffffffffe);
  T_00->ref = T_00->ref + 1;
  if ((uVar6 != 1) && (E = (DdNode *)((ulong)E ^ 1), uVar6 == 3)) {
    local_48 = (DdNode *)CONCAT44(local_48._4_4_,local_3c);
    E = cuddBddLICBuildResult(dd,pDVar3,cache,table);
    local_3c = (uint)local_48;
    if (E == (DdNode *)0x0) goto LAB_00656937;
  }
  uVar4 = (ulong)E & 0xfffffffffffffffe;
  piVar1 = (int *)(uVar4 + 4);
  *piVar1 = *piVar1 + 1;
  local_50 = E;
  if ((uVar6 == 0 || 3 < local_3c) && (local_50 = T, uVar6 != 0 || local_3c < 4)) {
    if (((ulong)T & 1) == 0) {
      pDVar3 = T;
      if (T != E) {
        local_48 = T;
        T = cuddUniqueInter(dd,local_40,T,E);
        pDVar3 = local_48;
      }
      local_50 = T;
      if (T == (DdNode *)0x0) {
LAB_006569ab:
        Cudd_IterDerefBdd(dd,E);
        T = pDVar3;
        goto LAB_00656937;
      }
    }
    else {
      E = (DdNode *)((ulong)E ^ 1);
      pDVar3 = T_00;
      if ((T_00 != E) && (pDVar3 = cuddUniqueInter(dd,local_40,T_00,E), pDVar3 == (DdNode *)0x0)) {
        pDVar3 = T_00;
        local_50 = (DdNode *)0x0;
        goto LAB_006569ab;
      }
      local_50 = (DdNode *)((ulong)pDVar3 ^ 1);
    }
  }
  T_00->ref = T_00->ref - 1;
  piVar1 = (int *)(uVar4 + 4);
  *piVar1 = *piVar1 + -1;
  iVar2 = st__insert(cache,(char *)piVar5,(char *)local_50);
  if (iVar2 != -10000) {
    return (DdNode *)((ulong)((uint)f & 1) ^ (ulong)local_50);
  }
  piVar5 = (int *)(((ulong)local_50 & 0xfffffffffffffffe) + 4);
  *piVar5 = *piVar5 + 1;
  T = local_50;
LAB_00656937:
  Cudd_IterDerefBdd(dd,T);
  return (DdNode *)0x0;
}

Assistant:

static DdNode *
cuddBddLICBuildResult(
  DdManager * dd,
  DdNode * f,
  st__table * cache,
  st__table * table)
{
    DdNode *Fv, *Fnv, *r, *t, *e;
    DdNode *one, *zero;
    int index;
    int comple;
    int markT, markE, markings;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    if (Cudd_IsConstant(f)) return(f);
    /* Make canonical to increase the utilization of the cache. */
    comple = Cudd_IsComplement(f);
    f = Cudd_Regular(f);

    /* Check the cache. */
    if ( st__lookup(cache, (const char *)f, (char **)&r)) {
        return(Cudd_NotCond(r,comple));
    }

    /* Retrieve the edge markings. */
    if ( st__lookup_int(table, (char *)f, &markings) == 0)
        return(NULL);
    markT = markings >> 2;
    markE = markings & 3;

    index = f->index;
    Fv = cuddT(f); Fnv = cuddE(f);

    if (markT == DD_LIC_NL) {
        t = cuddBddLICBuildResult(dd,Fv,cache,table);
        if (t == NULL) {
            return(NULL);
        }
    } else if (markT == DD_LIC_1) {
        t = one;
    } else {
        t = zero;
    }
    cuddRef(t);
    if (markE == DD_LIC_NL) {
        e = cuddBddLICBuildResult(dd,Fnv,cache,table);
        if (e == NULL) {
            Cudd_IterDerefBdd(dd,t);
            return(NULL);
        }
    } else if (markE == DD_LIC_1) {
        e = one;
    } else {
        e = zero;
    }
    cuddRef(e);

    if (markT == DD_LIC_DC && markE != DD_LIC_DC) {
        r = e;
    } else if (markT != DD_LIC_DC && markE == DD_LIC_DC) {
        r = t;
    } else {
        if (Cudd_IsComplement(t)) {
            t = Cudd_Not(t);
            e = Cudd_Not(e);
            r = (t == e) ? t : cuddUniqueInter(dd, index, t, e);
            if (r == NULL) {
                Cudd_IterDerefBdd(dd, e);
                Cudd_IterDerefBdd(dd, t);
                return(NULL);
            }
            r = Cudd_Not(r);
        } else {
            r = (t == e) ? t : cuddUniqueInter(dd, index, t, e);
            if (r == NULL) {
                Cudd_IterDerefBdd(dd, e);
                Cudd_IterDerefBdd(dd, t);
                return(NULL);
            }
        }
    }
    cuddDeref(t);
    cuddDeref(e);

    if ( st__insert(cache, (char *)f, (char *)r) == st__OUT_OF_MEM) {
        cuddRef(r);
        Cudd_IterDerefBdd(dd,r);
        return(NULL);
    }

    return(Cudd_NotCond(r,comple));

}